

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O0

Restaurant * __thiscall Restaurant::logOpenTableMsg_abi_cxx11_(Restaurant *this)

{
  long in_RSI;
  Restaurant *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x58));
  return this;
}

Assistant:

std::string Restaurant::logOpenTableMsg()
{
    return newMsg;
}